

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nordic_itch_handler.cc
# Opt level: O1

void __thiscall
helix::nasdaq::nordic_itch_handler::process_msg(nordic_itch_handler *this,itch_order_delete *m)

{
  ulong uVar1;
  order_book *this_00;
  _Hash_node_base *p_Var2;
  undefined8 uVar3;
  long lVar4;
  _Hash_node_base *__filename;
  ulong uVar5;
  uint64_t timestamp;
  itch_order_delete *piVar6;
  __node_base_ptr p_Var7;
  __node_base_ptr p_Var8;
  event local_50;
  
  lVar4 = 1;
  do {
    if (m->OrderReferenceNumber[lVar4 + -1] != ' ') {
      piVar6 = (itch_order_delete *)(m->OrderReferenceNumber + lVar4 + -1);
      break;
    }
    lVar4 = lVar4 + 1;
    piVar6 = m + 1;
  } while (lVar4 != 10);
  __filename = (_Hash_node_base *)0x0;
  for (; piVar6 != m + 1; piVar6 = (itch_order_delete *)piVar6->OrderReferenceNumber) {
    __filename = (_Hash_node_base *)((long)piVar6->MsgType + (long)__filename * 10 + -0x30);
  }
  uVar1 = (this->order_id_map)._M_h._M_bucket_count;
  uVar5 = (ulong)__filename % uVar1;
  p_Var7 = (this->order_id_map)._M_h._M_buckets[uVar5];
  p_Var8 = (__node_base_ptr)0x0;
  if ((p_Var7 != (__node_base_ptr)0x0) &&
     (p_Var2 = p_Var7->_M_nxt, p_Var8 = p_Var7, __filename != p_Var7->_M_nxt[1]._M_nxt)) {
    while (p_Var7 = p_Var2, p_Var2 = p_Var7->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
      p_Var8 = (__node_base_ptr)0x0;
      if (((ulong)p_Var2[1]._M_nxt % uVar1 != uVar5) ||
         (p_Var8 = p_Var7, __filename == p_Var2[1]._M_nxt)) goto LAB_001181d4;
    }
    p_Var8 = (__node_base_ptr)0x0;
  }
LAB_001181d4:
  if (p_Var8 == (__node_base_ptr)0x0) {
    p_Var2 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var2 = p_Var8->_M_nxt;
  }
  if (p_Var2 != (_Hash_node_base *)0x0) {
    this_00 = (order_book *)p_Var2[2]._M_nxt;
    order_book::remove(this_00,(char *)__filename);
    timestamp = this->time_sec * 1000 + this->time_msec;
    this_00->_timestamp = timestamp;
    make_ob_event(&local_50,(string *)this_00,timestamp,this_00,0);
    if ((this->_process_event).super__Function_base._M_manager == (_Manager_type)0x0) {
      uVar3 = std::__throw_bad_function_call();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._symbol._M_dataplus._M_p != &local_50._symbol.field_2) {
        operator_delete(local_50._symbol._M_dataplus._M_p,
                        local_50._symbol.field_2._M_allocated_capacity + 1);
      }
      _Unwind_Resume(uVar3);
    }
    (*(this->_process_event)._M_invoker)((_Any_data *)&this->_process_event,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._symbol._M_dataplus._M_p != &local_50._symbol.field_2) {
      operator_delete(local_50._symbol._M_dataplus._M_p,
                      local_50._symbol.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void nordic_itch_handler::process_msg(const itch_order_delete* m)
{
    uint64_t order_id = itch_uatoi(m->OrderReferenceNumber, sizeof(m->OrderReferenceNumber));
    auto it = order_id_map.find(order_id);
    if (it != order_id_map.end()) {
        auto& ob = it->second;
        ob.remove(order_id);
        ob.set_timestamp(timestamp());
        _process_event(make_ob_event(ob.symbol(), timestamp(), &ob));
    }
}